

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateEqualsCode
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  char *text;
  
  text = "result = result && get$capitalized_name$()\n    .equals(other.get$capitalized_name$());\n"
  ;
  if (*(int *)(*(long *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 0x30) + 0x8c)
      == 3) {
    text = 
    "result = result && get$capitalized_name$Value()\n    == other.get$capitalized_name$Value();\n";
  }
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::
GenerateEqualsCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "result = result && get$capitalized_name$Value()\n"
      "    == other.get$capitalized_name$Value();\n");
  } else {
    printer->Print(variables_,
      "result = result && get$capitalized_name$()\n"
      "    .equals(other.get$capitalized_name$());\n");
  }
}